

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Escape::CGraph::print(CGraph *this,FILE *f)

{
  EdgeIdx *pEVar1;
  EdgeIdx *pEVar2;
  long lVar3;
  EdgeIdx EVar4;
  
  fprintf((FILE *)f,"nVertices=%lld nEdges=%lld\n",this->nVertices,this->nEdges);
  lVar3 = 0;
  while (lVar3 < this->nVertices) {
    fprintf((FILE *)f,"%lld: ",lVar3);
    pEVar2 = this->offsets;
    pEVar1 = pEVar2 + lVar3;
    lVar3 = lVar3 + 1;
    for (EVar4 = *pEVar1; EVar4 < pEVar2[lVar3]; EVar4 = EVar4 + 1) {
      fprintf((FILE *)f,"%lld ",this->nbors[EVar4]);
      pEVar2 = this->offsets;
    }
    fputc(10,(FILE *)f);
  }
  return;
}

Assistant:

void CGraph::print(FILE *f) const {
    fprintf(f, "nVertices=%lld nEdges=%lld\n", (int64_t) nVertices, (int64_t) nEdges);
    for (VertexIdx i = 0; i < nVertices; ++i) {
        fprintf(f, "%lld: ", (int64_t) i);
        for (EdgeIdx j = offsets[i]; j < offsets[i + 1]; ++j)
            fprintf(f, "%lld ", (int64_t) nbors[j]);
        fprintf(f, "\n");
    }
}